

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O1

bool __thiscall
axl::io::MappedFile::setup(MappedFile *this,size_t maxDynamicViewCount,size_t readAheadSize)

{
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_28;
  
  if (maxDynamicViewCount == 0) {
    err::Error::Error((Error *)&local_28,0x16);
    local_48.m_p = (ErrorHdr *)0x0;
    local_48.m_hdr = (BufHdr *)0x0;
    local_48.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_48,&local_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_28);
    err::setError((ErrorRef *)&local_48);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
  }
  else {
    this->m_maxDynamicViewCount = maxDynamicViewCount;
    this->m_readAheadSize = readAheadSize;
    MappedViewMgr::limitViewCount(&this->m_dynamicViewMgr,maxDynamicViewCount);
  }
  return maxDynamicViewCount != 0;
}

Assistant:

bool
MappedFile::setup(
	size_t maxDynamicViewCount,
	size_t readAheadSize
) {
	if (!maxDynamicViewCount)
		return err::fail(err::SystemErrorCode_InvalidParameter);

	m_maxDynamicViewCount = maxDynamicViewCount;
	m_readAheadSize = readAheadSize;

	m_dynamicViewMgr.limitViewCount(maxDynamicViewCount);
	return true;
}